

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoopGroup.cpp
# Opt level: O0

void __thiscall Liby::EventLoopGroup::~EventLoopGroup(EventLoopGroup *this)

{
  bool bVar1;
  reference this_00;
  thread *th;
  iterator __end1;
  iterator __begin1;
  vector<std::thread,_std::allocator<std::thread>_> *__range1;
  EventLoopGroup *this_local;
  
  __end1 = std::vector<std::thread,_std::allocator<std::thread>_>::begin(&this->threads_);
  th = (thread *)std::vector<std::thread,_std::allocator<std::thread>_>::end(&this->threads_);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                                     *)&th), bVar1) {
    this_00 = __gnu_cxx::
              __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
              ::operator*(&__end1);
    bVar1 = std::thread::joinable(this_00);
    if (bVar1) {
      std::thread::join();
    }
    __gnu_cxx::
    __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
    operator++(&__end1);
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&this->threads_);
  std::vector<Liby::EventLoop_*,_std::allocator<Liby::EventLoop_*>_>::~vector(&this->ploops_);
  std::vector<std::shared_ptr<Liby::EventLoop>,_std::allocator<std::shared_ptr<Liby::EventLoop>_>_>
  ::~vector(&this->loops_);
  std::__cxx11::string::~string((string *)&this->chooser_);
  std::function<bool_()>::~function(&this->bf_);
  return;
}

Assistant:

EventLoopGroup::~EventLoopGroup() {
    for (auto &th : threads_) {
        if (th.joinable()) {
            th.join();
        }
    }
}